

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int AF_A_FireArrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  DObject *this;
  AWeapon *this_00;
  APlayerPawn *this_01;
  bool bVar3;
  int iVar4;
  AActor *source;
  char *pcVar5;
  PClassActor *type;
  byte bVar6;
  FSoundID local_24;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0054f16e;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0054f136;
  source = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_0054ef4b;
    bVar3 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0054f16e;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_0054f136;
LAB_0054ef4b:
    source = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_0054f136:
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0054f16e;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar3)) {
          pcVar5 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054f16e;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_0054f136;
    }
    if (2 < (uint)numparam) {
      VVar2 = param[2].field_0.field_3.Type;
      if ((VVar2 != 0xff) &&
         ((VVar2 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_0054f16e:
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (numparam != 3) {
        if (param[3].field_0.field_3.Type == '\x03') {
          type = (PClassActor *)param[3].field_0.field_1.a;
          if (param[3].field_0.field_1.atag == 1) {
            if (type != (PClassActor *)0x0) {
              bVar3 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
              bVar6 = 1;
              if (bVar3) goto LAB_0054f02b;
              pcVar5 = "ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054f146;
            }
          }
          else if (type != (PClassActor *)0x0) goto LAB_0054f13f;
          bVar6 = 0;
          type = (PClassActor *)0x0;
LAB_0054f02b:
          if (source->player != (player_t *)0x0) {
            this_00 = source->player->ReadyWeapon;
            if (this_00 != (AWeapon *)0x0) {
              bVar3 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1);
              bVar6 = bVar6 & bVar3;
            }
            if (bVar6 != 0) {
              dVar1 = (source->Angles).Yaw.Degrees;
              iVar4 = FRandom::Random2(&pr_electric);
              this_01 = source->player->mo;
              (source->Angles).Yaw.Degrees =
                   (1.0 / (double)(1 << ((byte)((this_01->super_AActor).accuracy / 0x14) & 0x1f))) *
                   (double)iVar4 * 0.02197265625 + (source->Angles).Yaw.Degrees;
              APlayerPawn::PlayAttacking2(this_01);
              P_SpawnPlayerMissile(source,type);
              (source->Angles).Yaw.Degrees = dVar1;
              local_24.ID = S_FindSound("weapons/xbowshoot");
              S_Sound(source,1,&local_24,1.0,1.0);
            }
          }
          return 0;
        }
LAB_0054f13f:
        pcVar5 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0054f146;
      }
    }
  }
  pcVar5 = "(paramnum) < numparam";
LAB_0054f146:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0xfc,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FireArrow)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_CLASS(ti, AActor);

	DAngle savedangle;

	if (self->player == NULL)
		return 0;

	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}

	if (ti) 
	{
		savedangle = self->Angles.Yaw;
		self->Angles.Yaw += pr_electric.Random2() * (5.625/256) * self->player->mo->AccuracyFactor();
		self->player->mo->PlayAttacking2 ();
		P_SpawnPlayerMissile (self, ti);
		self->Angles.Yaw = savedangle;
		S_Sound (self, CHAN_WEAPON, "weapons/xbowshoot", 1, ATTN_NORM);
	}
	return 0;
}